

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void build_backtrace(JSContext *ctx,JSValue error_obj,char *filename,int line_num,
                    int backtrace_flags)

{
  long lVar1;
  JSValue func;
  JSValue val;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  undefined1 auVar2 [16];
  BOOL BVar3;
  long in_RCX;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  JSValue JVar4;
  int line_num1;
  char *atom_str;
  JSFunctionBytecode *b;
  BOOL backtrace_barrier;
  JSObject *p;
  char *str1;
  char *func_name_str;
  DynBuf dbuf;
  JSValue str;
  JSStackFrame *sf;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint8_t c;
  JSContext *in_stack_fffffffffffffee0;
  JSContext *in_stack_fffffffffffffee8;
  JSContext *ctx_00;
  undefined1 in_stack_fffffffffffffef0 [16];
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  JSContext *in_stack_ffffffffffffff18;
  long in_stack_ffffffffffffff20;
  JSAtom prop;
  JSContext *in_stack_ffffffffffffff28;
  JSValueUnion in_stack_ffffffffffffff30;
  JSValueUnion in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  char *local_a8;
  int flags;
  char *in_stack_ffffffffffffff60;
  DynBuf local_98;
  JSValueUnion local_68;
  int64_t iStack_60;
  undefined8 *local_50;
  uint local_48;
  uint local_44;
  long local_40;
  long local_38;
  uint local_1c;
  long local_18;
  uint local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  local_48 = in_R9D;
  local_44 = in_R8D;
  local_40 = in_RCX;
  local_38 = in_RDI;
  js_dbuf_init(in_stack_fffffffffffffee0,
               (DynBuf *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (local_40 != 0) {
    dbuf_printf(&local_98,"    at %s",local_40);
    if (local_44 != 0xffffffff) {
      dbuf_printf(&local_98,":%d",(ulong)local_44);
    }
    dbuf_putc((DynBuf *)in_stack_fffffffffffffee0,(uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18)
             );
    JVar4 = JS_NewString(in_stack_fffffffffffffef0._0_8_,(char *)in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff38 = JVar4.u;
    in_stack_ffffffffffffff40 = JVar4.tag;
    this_obj.tag._0_4_ = in_stack_ffffffffffffff48;
    this_obj.u.ptr = (void *)in_stack_ffffffffffffff40;
    this_obj.tag._4_4_ = in_stack_ffffffffffffff4c;
    JVar4.tag = (int64_t)in_stack_ffffffffffffff38.ptr;
    JVar4.u.float64 = in_stack_ffffffffffffff30.float64;
    local_68 = in_stack_ffffffffffffff38;
    iStack_60 = in_stack_ffffffffffffff40;
    JS_DefinePropertyValue
              (in_stack_ffffffffffffff28,this_obj,(JSAtom)((ulong)in_stack_ffffffffffffff20 >> 0x20)
               ,JVar4,(int)in_stack_ffffffffffffff60);
    local_18 = local_38;
    local_1c = local_44;
    local_10 = local_44;
    local_8 = 0;
    in_stack_ffffffffffffff28 = (JSContext *)CONCAT44(uStack_c,local_44);
    in_stack_ffffffffffffff30.float64 = 0.0;
    this_obj_00.tag._0_4_ = in_stack_ffffffffffffff48;
    this_obj_00.u.ptr = (void *)in_stack_ffffffffffffff40;
    this_obj_00.tag._4_4_ = in_stack_ffffffffffffff4c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_stack_ffffffffffffff38;
    JS_DefinePropertyValue
              (in_stack_ffffffffffffff28,this_obj_00,
               (JSAtom)((ulong)in_stack_ffffffffffffff20 >> 0x20),(JSValue)(auVar2 << 0x40),
               (int)in_stack_ffffffffffffff60);
    flags = (int)in_stack_ffffffffffffff60;
    prop = (JSAtom)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    ctx_00 = in_stack_fffffffffffffef0._0_8_;
    c = (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18);
    if ((local_48 & 2) != 0) goto LAB_00141c6d;
  }
  local_50 = *(undefined8 **)(*(long *)(local_38 + 0x18) + 0xf8);
  while( true ) {
    flags = (int)in_stack_ffffffffffffff60;
    prop = (JSAtom)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    ctx_00 = in_stack_fffffffffffffef0._0_8_;
    c = (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18);
    if (local_50 == (undefined8 *)0x0) break;
    if ((local_48 & 1) == 0) {
      func.u._4_4_ = in_stack_ffffffffffffff04;
      func.u.int32 = in_stack_ffffffffffffff00;
      func.tag._0_4_ = in_stack_ffffffffffffff08;
      func.tag._4_4_ = in_stack_ffffffffffffff0c;
      in_stack_ffffffffffffff60 = get_func_name(in_stack_fffffffffffffef0._8_8_,func);
      if ((in_stack_ffffffffffffff60 == (char *)0x0) ||
         (local_a8 = in_stack_ffffffffffffff60, *in_stack_ffffffffffffff60 == '\0')) {
        local_a8 = "<anonymous>";
      }
      dbuf_printf(&local_98,"    at %s",local_a8);
      JS_FreeCString(in_stack_fffffffffffffef0._0_8_,(char *)in_stack_fffffffffffffee8);
      lVar1 = local_50[1];
      in_stack_ffffffffffffff4c = 0;
      BVar3 = js_class_has_bytecode((uint)*(ushort *)(lVar1 + 6));
      if (BVar3 == 0) {
        dbuf_printf(&local_98," (native)");
      }
      else {
        in_stack_ffffffffffffff20 = *(long *)(lVar1 + 0x30);
        in_stack_ffffffffffffff4c =
             (uint)((byte)((ushort)*(undefined2 *)(in_stack_ffffffffffffff20 + 0x19) >> 0xb) & 1);
        if ((*(ushort *)(in_stack_ffffffffffffff20 + 0x19) >> 10 & 1) != 0) {
          in_stack_ffffffffffffff14 =
               find_line_num(in_stack_ffffffffffffff18,
                             (JSFunctionBytecode *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
          in_stack_ffffffffffffff18 =
               (JSContext *)
               JS_AtomToCString((JSContext *)
                                CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                in_stack_ffffffffffffff04);
          in_stack_fffffffffffffee8 = in_stack_ffffffffffffff18;
          if (in_stack_ffffffffffffff18 == (JSContext *)0x0) {
            in_stack_fffffffffffffee8 = (JSContext *)"<null>";
          }
          dbuf_printf(&local_98," (%s",in_stack_fffffffffffffee8);
          JS_FreeCString(in_stack_fffffffffffffef0._0_8_,(char *)in_stack_fffffffffffffee8);
          if (in_stack_ffffffffffffff14 != 0xffffffff) {
            dbuf_printf(&local_98,":%d",(ulong)in_stack_ffffffffffffff14);
          }
          dbuf_putc((DynBuf *)in_stack_fffffffffffffee0,
                    (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18));
        }
      }
      dbuf_putc((DynBuf *)in_stack_fffffffffffffee0,
                (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18));
      flags = (int)in_stack_ffffffffffffff60;
      prop = (JSAtom)((ulong)in_stack_ffffffffffffff20 >> 0x20);
      ctx_00 = in_stack_fffffffffffffef0._0_8_;
      c = (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18);
      if (in_stack_ffffffffffffff4c != 0) break;
    }
    else {
      local_48 = local_48 & 0xfffffffe;
    }
    local_50 = (undefined8 *)*local_50;
  }
LAB_00141c6d:
  dbuf_putc((DynBuf *)in_stack_fffffffffffffee0,c);
  BVar3 = dbuf_error(&local_98);
  if (BVar3 == 0) {
    JVar4 = JS_NewString(ctx_00,(char *)in_stack_fffffffffffffee8);
    local_68 = JVar4.u;
    iStack_60 = JVar4.tag;
  }
  else {
    local_68.ptr = (void *)((ulong)in_stack_ffffffffffffff04 << 0x20);
    iStack_60 = 2;
  }
  dbuf_free((DynBuf *)0x141d01);
  this_obj_01.tag._0_4_ = in_stack_ffffffffffffff48;
  this_obj_01.u = (JSValueUnion)in_stack_ffffffffffffff40;
  this_obj_01.tag._4_4_ = in_stack_ffffffffffffff4c;
  val.tag = (int64_t)in_stack_ffffffffffffff38.ptr;
  val.u.float64 = in_stack_ffffffffffffff30.float64;
  JS_DefinePropertyValue(in_stack_ffffffffffffff28,this_obj_01,prop,val,flags);
  return;
}

Assistant:

static void build_backtrace(JSContext *ctx, JSValueConst error_obj,
                            const char *filename, int line_num,
                            int backtrace_flags)
{
    JSStackFrame *sf;
    JSValue str;
    DynBuf dbuf;
    const char *func_name_str;
    const char *str1;
    JSObject *p;
    BOOL backtrace_barrier;
    
    js_dbuf_init(ctx, &dbuf);
    if (filename) {
        dbuf_printf(&dbuf, "    at %s", filename);
        if (line_num != -1)
            dbuf_printf(&dbuf, ":%d", line_num);
        dbuf_putc(&dbuf, '\n');
        str = JS_NewString(ctx, filename);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_fileName, str,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_lineNumber, JS_NewInt32(ctx, line_num),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        if (backtrace_flags & JS_BACKTRACE_FLAG_SINGLE_LEVEL)
            goto done;
    }
    for(sf = ctx->rt->current_stack_frame; sf != NULL; sf = sf->prev_frame) {
        if (backtrace_flags & JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL) {
            backtrace_flags &= ~JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL;
            continue;
        }
        func_name_str = get_func_name(ctx, sf->cur_func);
        if (!func_name_str || func_name_str[0] == '\0')
            str1 = "<anonymous>";
        else
            str1 = func_name_str;
        dbuf_printf(&dbuf, "    at %s", str1);
        JS_FreeCString(ctx, func_name_str);

        p = JS_VALUE_GET_OBJ(sf->cur_func);
        backtrace_barrier = FALSE;
        if (js_class_has_bytecode(p->class_id)) {
            JSFunctionBytecode *b;
            const char *atom_str;
            int line_num1;

            b = p->u.func.function_bytecode;
            backtrace_barrier = b->backtrace_barrier;
            if (b->has_debug) {
                line_num1 = find_line_num(ctx, b,
                                          sf->cur_pc - b->byte_code_buf - 1);
                atom_str = JS_AtomToCString(ctx, b->debug.filename);
                dbuf_printf(&dbuf, " (%s",
                            atom_str ? atom_str : "<null>");
                JS_FreeCString(ctx, atom_str);
                if (line_num1 != -1)
                    dbuf_printf(&dbuf, ":%d", line_num1);
                dbuf_putc(&dbuf, ')');
            }
        } else {
            dbuf_printf(&dbuf, " (native)");
        }
        dbuf_putc(&dbuf, '\n');
        /* stop backtrace if JS_EVAL_FLAG_BACKTRACE_BARRIER was used */
        if (backtrace_barrier)
            break;
    }
 done:
    dbuf_putc(&dbuf, '\0');
    if (dbuf_error(&dbuf))
        str = JS_NULL;
    else
        str = JS_NewString(ctx, (char *)dbuf.buf);
    dbuf_free(&dbuf);
    JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_stack, str,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
}